

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maropuparser.h
# Opt level: O0

int __thiscall
FastPForLib::MaropuGapReader::open(MaropuGapReader *this,char *__file,int __oflag,...)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  ostream *poVar4;
  int *piVar5;
  runtime_error *this_00;
  
  close(this,(int)__file);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(pcVar2,"rb");
  this->fd = (FILE *)pFVar3;
  if (this->fd == (FILE *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"IO status: ");
    piVar5 = __errno_location();
    pcVar2 = strerror(*piVar5);
    poVar4 = std::operator<<(poVar4,pcVar2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cerr,"Can\'t open ");
    poVar4 = std::operator<<(poVar4,(string *)this);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"could not open temp file");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = setvbuf((FILE *)this->fd,(char *)0x0,0,0x1000);
  return iVar1;
}

Assistant:

void open() {
    close();
    fd = ::fopen(mFilename.c_str(), "rb");
    if (fd == NULL) {
      std::cerr << "IO status: " << strerror(errno) << std::endl;
      std::cerr << "Can't open " << mFilename << std::endl;
      throw std::runtime_error("could not open temp file");
    }
    setvbuf(fd, NULL, _IOFBF, 1024 * 4); // large buffer
  }